

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall
cpp_client::Any::Any<std::shared_ptr<cpp_client::Base_object>>
          (Any *this,shared_ptr<cpp_client::Base_object> *other)

{
  holder2<std::shared_ptr<cpp_client::Base_object>> *this_00;
  shared_ptr<cpp_client::Base_object> *other_local;
  Any *this_local;
  
  this_00 = (holder2<std::shared_ptr<cpp_client::Base_object>> *)operator_new(0x18);
  holder2<std::shared_ptr<cpp_client::Base_object>>::
  holder2<std::shared_ptr<cpp_client::Base_object>>(this_00,other);
  std::unique_ptr<cpp_client::Any::holder,std::default_delete<cpp_client::Any::holder>>::
  unique_ptr<std::default_delete<cpp_client::Any::holder>,void>
            ((unique_ptr<cpp_client::Any::holder,std::default_delete<cpp_client::Any::holder>> *)
             this,(pointer)this_00);
  return;
}

Assistant:

Any(T&& other) noexcept :
      data_(new holder2<T>(std::forward<T>(other)))
   {
      ;
   }